

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA256.cpp
# Opt level: O2

String * SHA256::hashFile(String *__return_storage_ptr__,Path *file,MapType type)

{
  MemoryMappedFile mmf;
  
  MemoryMappedFile::MemoryMappedFile(&mmf,file,READ_ONLY,DONT_LOCK);
  if (mmf.mAccessType == NO_ACCESS) {
    (__return_storage_ptr__->mString)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mString).field_2;
    (__return_storage_ptr__->mString)._M_string_length = 0;
    (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  }
  else {
    hash(__return_storage_ptr__,(char *)mmf.mpMapped,(uint)mmf.mFileSize,type);
  }
  MemoryMappedFile::~MemoryMappedFile(&mmf);
  return __return_storage_ptr__;
}

Assistant:

String SHA256::hashFile(const Path& file, MapType type)
{
    MemoryMappedFile mmf(file);
    if(!mmf.isOpen()) return String();
    return hash(static_cast<const char*>(mmf.filePtr()), mmf.size(), type);
}